

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.h
# Opt level: O0

aiTexture * __thiscall aiScene::GetEmbeddedTexture(aiScene *this,char *filename)

{
  uint uVar1;
  int iVar2;
  char *__s2;
  char *pcVar3;
  char *shortTextureFilename;
  uint i;
  char *shortFilename;
  int index;
  char *filename_local;
  aiScene *this_local;
  
  if (*filename == '*') {
    uVar1 = atoi(filename + 1);
    if (((int)uVar1 < 0) || (this->mNumTextures <= uVar1)) {
      this_local = (aiScene *)0x0;
    }
    else {
      this_local = (aiScene *)this->mTextures[(int)uVar1];
    }
  }
  else {
    __s2 = GetShortFilename(filename);
    for (shortTextureFilename._4_4_ = 0; shortTextureFilename._4_4_ < this->mNumTextures;
        shortTextureFilename._4_4_ = shortTextureFilename._4_4_ + 1) {
      pcVar3 = aiString::C_Str(&this->mTextures[shortTextureFilename._4_4_]->mFilename);
      pcVar3 = GetShortFilename(pcVar3);
      iVar2 = strcmp(pcVar3,__s2);
      if (iVar2 == 0) {
        return this->mTextures[shortTextureFilename._4_4_];
      }
    }
    this_local = (aiScene *)0x0;
  }
  return (aiTexture *)this_local;
}

Assistant:

const aiTexture* GetEmbeddedTexture(const char* filename) const {
        // lookup using texture ID (if referenced like: "*1", "*2", etc.)
        if ('*' == *filename) {
            int index = std::atoi(filename + 1);
            if (0 > index || mNumTextures <= static_cast<unsigned>(index))
                return nullptr;
            return mTextures[index];
        }
        // lookup using filename
        const char* shortFilename = GetShortFilename(filename);
        for (unsigned int i = 0; i < mNumTextures; i++) {
            const char* shortTextureFilename = GetShortFilename(mTextures[i]->mFilename.C_Str());
            if (strcmp(shortTextureFilename, shortFilename) == 0) {
                return mTextures[i];
            }
        }
        return nullptr;
    }